

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O1

_Bool do_cmd_disarm_test(player *p,loc grid)

{
  _Bool _Var1;
  _Bool _Var2;
  
  _Var1 = square_isknown(cave,grid);
  if (_Var1) {
    _Var1 = square_iscloseddoor(cave,grid);
    if ((_Var1) && (_Var1 = square_islockeddoor(cave,grid), !_Var1)) {
      return true;
    }
    _Var2 = square_isdisarmabletrap(cave,grid);
    _Var1 = true;
    if (!_Var2) {
      _Var1 = false;
      msg("You see nothing there to disarm.");
      _Var2 = square_isdisarmabletrap((chunk_conflict *)p->cave,grid);
      if (_Var2) {
        square_memorize_traps((chunk *)cave,grid);
        square_light_spot((chunk *)cave,grid);
        _Var1 = false;
      }
    }
  }
  else {
    _Var1 = false;
    msg("You see nothing there.");
  }
  return _Var1;
}

Assistant:

static bool do_cmd_disarm_test(struct player *p, struct loc grid)
{
	/* Must have knowledge */
	if (!square_isknown(cave, grid)) {
		msg("You see nothing there.");
		return false;
	}

	/* Look for a closed, unlocked door to lock */
	if (square_iscloseddoor(cave, grid) && !square_islockeddoor(cave, grid))
		return true;

	/* Look for a trap */
	if (!square_isdisarmabletrap(cave, grid)) {
		msg("You see nothing there to disarm.");
		if (square_isdisarmabletrap(p->cave, grid)) {
			square_memorize_traps(cave, grid);
			square_light_spot(cave, grid);
		}
		return false;
	}

	/* Okay */
	return true;
}